

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O2

void __thiscall Callback::Emitter::emit<MyEmitter>(Emitter *this,offset_in_MyEmitter_to_subr signal)

{
  code *pcVar1;
  SignalActivation activation;
  SignalActivation local_50;
  MemberFuncPtr local_28;
  
  MemberFuncPtr::MemberFuncPtr<void(MyEmitter::*)()>(&local_28,signal);
  SignalActivation::SignalActivation(&local_50,this,&local_28);
  for (; local_50.begin.item != local_50.end.item; local_50.begin.item = (local_50.begin.item)->next
      ) {
    if (((local_50.begin.item)->value).state == connected) {
      pcVar1 = (code *)((local_50.begin.item)->value).slot.ptr;
      if (((ulong)pcVar1 & 1) != 0) {
        pcVar1 = *(code **)(pcVar1 + *(long *)((long)((local_50.begin.item)->value).object +
                                              *(long *)&((local_50.begin.item)->value).slot.
                                                        field_0x8) + -1);
      }
      (*pcVar1)();
    }
    if (local_50.invalidated != false) break;
  }
  SignalActivation::~SignalActivation(&local_50);
  return;
}

Assistant:

void emit(void (X::*signal)()) {SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected)
      (((X*)i->object)->*((MemberFuncPtr0<X>*)&i->slot)->ptr)(); if(activation.invalidated) return;}}